

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_mem.cc
# Opt level: O0

int mem_free(BIO *bio)

{
  BUF_MEM *a;
  BUF_MEM *b;
  BIO *bio_local;
  
  if (((bio->shutdown != 0) && (bio->init != 0)) && (bio->ptr != (void *)0x0)) {
    a = (BUF_MEM *)bio->ptr;
    if ((bio->flags & 0x200U) != 0) {
      a->data = (char *)0x0;
    }
    BUF_MEM_free(a);
    bio->ptr = (void *)0x0;
  }
  return 1;
}

Assistant:

static int mem_free(BIO *bio) {
  if (!bio->shutdown || !bio->init || bio->ptr == NULL) {
    return 1;
  }

  BUF_MEM *b = (BUF_MEM *)bio->ptr;
  if (bio->flags & BIO_FLAGS_MEM_RDONLY) {
    b->data = NULL;
  }
  BUF_MEM_free(b);
  bio->ptr = NULL;
  return 1;
}